

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_78::BinaryReaderIR::BeginGlobal
          (BinaryReaderIR *this,Index index,Type type,bool mutable_)

{
  pointer *__ptr;
  _Head_base<0UL,_wabt::GlobalModuleField_*,_false> local_58;
  GlobalModuleField *local_50;
  Location local_48;
  
  GetLocation(&local_48,this);
  MakeUnique<wabt::GlobalModuleField,wabt::Location>((wabt *)&local_50,&local_48);
  (local_50->global).type.enum_ = type.enum_;
  (local_50->global).mutable_ = mutable_;
  local_58._M_head_impl = local_50;
  local_50 = (GlobalModuleField *)0x0;
  Module::AppendField(this->module_,
                      (unique_ptr<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>_>
                       *)&local_58);
  if (local_58._M_head_impl != (GlobalModuleField *)0x0) {
    (*((local_58._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)1>).super_ModuleField.
      _vptr_ModuleField[1])();
  }
  local_58._M_head_impl = (GlobalModuleField *)0x0;
  if (local_50 != (GlobalModuleField *)0x0) {
    (**(code **)(*(long *)local_50 + 8))();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::BeginGlobal(Index index, Type type, bool mutable_) {
  auto field = MakeUnique<GlobalModuleField>(GetLocation());
  Global& global = field->global;
  global.type = type;
  global.mutable_ = mutable_;
  module_->AppendField(std::move(field));
  return Result::Ok;
}